

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::Bitstream::
     dynamicSizesMatch<slang::ast::Type,slang::ast::StreamingConcatenationExpression>
               (Type *destination,StreamingConcatenationExpression *source)

{
  bool bVar1;
  common_type_t<unsigned_long,_unsigned_long> cVar2;
  ulong __n;
  BitstreamSizeMode in_stack_0000000c;
  StreamingConcatenationExpression *in_stack_00000010;
  uint64_t remaining;
  DynamicSize destFill;
  uint64_t diff_1;
  uint64_t diff;
  DynamicSize destEmpty;
  DynamicSize sourceSize;
  ulong local_80;
  unsigned_long in_stack_ffffffffffffff88;
  unsigned_long in_stack_ffffffffffffff90;
  ulong local_68;
  DynamicSize local_48;
  DynamicSize local_30;
  bool local_1;
  
  dynamicBitstreamSize(in_stack_00000010,in_stack_0000000c);
  dynamicBitstreamSize((Type *)destEmpty.multiplier,diff._4_4_);
  bVar1 = DynamicSize::operator_cast_to_bool(&local_30);
  if ((!bVar1) || (bVar1 = DynamicSize::operator_cast_to_bool(&local_48), !bVar1)) {
    return false;
  }
  if (local_30.fixed <= local_48.fixed) {
    if (local_30.multiplier == 0) {
      return local_48.fixed - local_30.fixed == 0;
    }
    if ((local_48.fixed - local_30.fixed) % local_30.multiplier == 0) {
      return true;
    }
  }
  if (local_48.multiplier != 0) {
    if (local_30.fixed < local_48.fixed) {
      local_80 = local_48.fixed - local_30.fixed;
    }
    else {
      local_80 = local_30.fixed - local_48.fixed;
    }
    cVar2 = std::gcd<unsigned_long,unsigned_long>
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (local_80 % cVar2 == 0) {
      return true;
    }
  }
  dynamicBitstreamSize((Type *)destEmpty.multiplier,diff._4_4_);
  bVar1 = DynamicSize::operator_cast_to_bool((DynamicSize *)&stack0xffffffffffffff90);
  if (bVar1) {
    if (local_68 < local_30.fixed) {
      __n = local_30.fixed - local_68;
    }
    else {
      __n = local_68 - local_30.fixed;
    }
    if ((local_30.multiplier == 0) && (in_stack_ffffffffffffff90 == 0)) {
      local_1 = __n == 0;
    }
    else {
      cVar2 = std::gcd<unsigned_long,unsigned_long>(in_stack_ffffffffffffff90,__n);
      local_1 = __n % cVar2 == 0;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Bitstream::dynamicSizesMatch(const T1& destination, const T2& source) {
    auto sourceSize = dynamicBitstreamSize(source, BitstreamSizeMode::Source);
    auto destEmpty = dynamicBitstreamSize(destination, BitstreamSizeMode::DestEmpty);
    if (!sourceSize || !destEmpty)
        return false;

    if (destEmpty.fixed >= sourceSize.fixed) {
        auto diff = destEmpty.fixed - sourceSize.fixed;
        if (!sourceSize.multiplier)
            return diff == 0;
        if (diff % sourceSize.multiplier == 0)
            return true;
    }

    if (destEmpty.multiplier > 0) { // only for "with" range
        auto diff = destEmpty.fixed > sourceSize.fixed ? destEmpty.fixed - sourceSize.fixed
                                                       : sourceSize.fixed - destEmpty.fixed;
        if (diff % std::gcd(sourceSize.multiplier, destEmpty.multiplier) == 0)
            return true;
    }

    auto destFill = dynamicBitstreamSize(destination, BitstreamSizeMode::DestFill);
    if (!destFill)
        return false;

    /* Follow IEEE standard to check dynamic-sized types at compile-time.
     // runtime error
     struct {bit a[$]; shortint b;} a = {{1,2,3,4}, 67};
     int b = int'(a);
     // sourceMultiplier=1 sourceFixedSize=16 destEmptyMultiplier=0 destEmptyFixedSize=32
     // destFillMultiplier=0 destFillFixedSize=32

     // compile time error
     typedef struct {byte a[$]; bit b;} dest_t;
     int a;
     dest_t b = dest_t'(a);
     // sourceMultiplier=0 sourceFixedSize=32 destEmptyMultiplier=0 destEmptyFixedSize=1
     // destFillMultiplier=8 destFillFixedSize=1
     */

    uint64_t remaining;
    if (sourceSize.fixed > destFill.fixed)
        remaining = sourceSize.fixed - destFill.fixed;
    else
        remaining = destFill.fixed - sourceSize.fixed;

    if (sourceSize.multiplier == 0 && destFill.multiplier == 0)
        return remaining == 0;

    return remaining % std::gcd(sourceSize.multiplier, destFill.multiplier) == 0;
}